

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_83(QPDF *pdf,char *arg2)

{
  ostream *poVar1;
  shared_ptr<char> file_buf;
  size_t size;
  QPDFJob j;
  long local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  ulong local_48;
  QPDFJob local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  QPDFJob::QPDFJob(local_40);
  local_58 = 0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QUtil::read_file_into_memory(arg2,(shared_ptr *)&local_58,&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,"calling initializeFromJson");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,local_58,local_48 + local_58);
  QPDFJob::initializeFromJson((string *)local_40,SUB81(local_30,0));
  std::__cxx11::string::~string((string *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"called initializeFromJson");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

static void
test_83(QPDF& pdf, char const* arg2)
{
    // Test QPDFJob json with partial = false. For testing with
    // partial = true, we just use qpdf --job-json-file.

    QPDFJob j;
    std::shared_ptr<char> file_buf;
    size_t size;
    QUtil::read_file_into_memory(arg2, file_buf, size);
    try {
        std::cout << "calling initializeFromJson" << std::endl;
        j.initializeFromJson(std::string(file_buf.get(), size));
        std::cout << "called initializeFromJson" << std::endl;
    } catch (QPDFUsage& e) {
        std::cerr << "usage: " << e.what() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << e.what() << std::endl;
    }
}